

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_lyb.c
# Opt level: O0

LY_ERR lyb_print_lyb_type(ly_out *out,lyd_node *node,lyd_lyb_ctx *lybctx)

{
  lysc_node *plVar1;
  lysc_node *local_38;
  uint local_2c;
  LY_ERR ret__;
  lylyb_node_type lyb_type;
  lyd_lyb_ctx *lybctx_local;
  lyd_node *node_local;
  ly_out *out_local;
  
  if ((node->flags & 8) == 0) {
    if (node->schema == (lysc_node *)0x0) {
      local_2c = 2;
    }
    else {
      if (node->schema == (lysc_node *)0x0) {
        local_38 = (lysc_node *)0x0;
      }
      else {
        local_38 = node->schema->parent;
      }
      plVar1 = lysc_data_node(local_38);
      local_2c = (uint)(plVar1 != (lysc_node *)0x0);
    }
  }
  else {
    if (node->schema == (lysc_node *)0x0) {
      __assert_fail("node->schema",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_lyb.c"
                    ,0x3d0,
                    "LY_ERR lyb_print_lyb_type(struct ly_out *, const struct lyd_node *, struct lyd_lyb_ctx *)"
                   );
    }
    local_2c = 3;
  }
  out_local._4_4_ = lyb_write_number((ulong)local_2c,1,out,lybctx->lybctx);
  if (out_local._4_4_ == LY_SUCCESS) {
    out_local._4_4_ = LY_SUCCESS;
  }
  return out_local._4_4_;
}

Assistant:

static LY_ERR
lyb_print_lyb_type(struct ly_out *out, const struct lyd_node *node, struct lyd_lyb_ctx *lybctx)
{
    enum lylyb_node_type lyb_type;

    if (node->flags & LYD_EXT) {
        assert(node->schema);
        lyb_type = LYB_NODE_EXT;
    } else if (!node->schema) {
        lyb_type = LYB_NODE_OPAQ;
    } else if (!lysc_data_parent(node->schema)) {
        lyb_type = LYB_NODE_TOP;
    } else {
        lyb_type = LYB_NODE_CHILD;
    }

    LY_CHECK_RET(lyb_write_number(lyb_type, 1, out, lybctx->lybctx));

    return LY_SUCCESS;
}